

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

void do_genocide(int how,boolean only_on_level)

{
  bool bVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  monst *pmVar5;
  int *local_198;
  int *local_188;
  char *local_170;
  int local_150;
  uint local_14c;
  int cnt;
  int gonecnt;
  monst *mtmp2;
  monst *mtmp;
  char *which;
  permonst *ptr;
  int mndx;
  int killplayer;
  int i;
  char buf [256];
  boolean only_on_level_local;
  int how_local;
  
  bVar1 = false;
  if ((how & 2U) == 0) {
    for (mndx = 0; mndx < 5; mndx = mndx + 1) {
      getlin("What monster do you want to genocide? [type the name]",(char *)&killplayer);
      mungspaces((char *)&killplayer);
      iVar3 = strncasecmp((char *)&killplayer,"none",0xffffffffffffffff);
      if ((iVar3 == 0) ||
         (iVar3 = strncasecmp((char *)&killplayer,"nothing",0xffffffffffffffff), iVar3 == 0)) {
        if ((how & 1U) != 0) {
          return;
        }
        which = (char *)rndmonst(level);
        if ((permonst *)which == (permonst *)0x0) {
          return;
        }
        ptr._4_4_ = monsndx((permonst *)which);
        goto LAB_002b6d40;
      }
      if ((flags.debug != '\0') && ((char)killplayer == '*')) {
        local_14c = 0;
        pmVar5 = level->monlist;
        while (mtmp2 = pmVar5, mtmp2 != (monst *)0x0) {
          pmVar5 = mtmp2->nmon;
          if (0 < mtmp2->mhp) {
            mongone(mtmp2);
            local_14c = local_14c + 1;
          }
        }
        pcVar4 = "s";
        if (local_14c == 1) {
          pcVar4 = "";
        }
        pline("Eliminated %d monster%s.",(ulong)local_14c,pcVar4);
        return;
      }
      ptr._4_4_ = name_to_mon((char *)&killplayer);
      if ((ptr._4_4_ == -1) || ((mvitals[ptr._4_4_].mvflags & 2) != 0)) {
        pcVar4 = "no longer";
        if (ptr._4_4_ == -1) {
          pcVar4 = "do not";
        }
        pline("Such creatures %s exist in this world.",pcVar4);
      }
      else {
        which = (char *)(mons + ptr._4_4_);
        if ((ptr._4_4_ == urole.malenum) ||
           ((((urole.femalenum != -1 && (ptr._4_4_ == urole.femalenum)) ||
             (ptr._4_4_ == urace.malenum)) ||
            ((urace.femalenum != -1 && (ptr._4_4_ == urace.femalenum)))))) {
          bVar1 = true;
          goto LAB_002b6d40;
        }
        if ((mons[ptr._4_4_].mflags2 & 8) != 0) {
          iVar3 = sgn((int)u.ualign.type);
          adjalign(-iVar3);
        }
        if ((mons[ptr._4_4_].mflags2 & 0x200) != 0) {
          iVar3 = sgn((int)u.ualign.type);
          adjalign(iVar3);
        }
        if ((mons[ptr._4_4_].geno & 0x20) != 0) {
          if (((u.uprops[0x3d].intrinsic != 0) || (u.uprops[0x3d].extrinsic != 0)) &&
             ((permonst *)which == youmonst.data)) {
            bVar1 = true;
          }
          goto LAB_002b6d40;
        }
        if (flags.soundok != '\0') {
          if (flags.verbose != '\0') {
            pline("A thunderous voice booms through the caverns:");
          }
          verbalize("No, mortal!  That will not be done.");
        }
      }
    }
    pline("That\'s enough tries!");
  }
  else {
    ptr._4_4_ = u.umonster;
    which = (char *)(mons + u.umonster);
    pcVar4 = mons_mname((permonst *)which);
    strcpy((char *)&killplayer,pcVar4);
    bVar1 = true;
LAB_002b6d40:
    mtmp = (monst *)anon_var_dwarf_90d11;
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
      pcVar4 = mons_mname((permonst *)which);
      strcpy((char *)&killplayer,pcVar4);
      if ((((*(ushort *)(which + 0xe) & 0x1000) != 0) && ((permonst *)which != mons + 0x120)) &&
         (mtmp = (monst *)0x3668bb, (*(uint *)(which + 0x34) & 0x80000) == 0)) {
        mtmp = (monst *)0x36d51e;
      }
    }
    else if (u.umonnum == u.umonster) {
      if ((flags.female == '\0') || (urole.name.f == (char *)0x0)) {
        local_170 = urole.name.m;
      }
      else {
        local_170 = urole.name.f;
      }
      strcpy((char *)&killplayer,local_170);
      killplayer._0_1_ = lowc((char)killplayer);
    }
    else {
      pcVar4 = mons_mname(youmonst.data);
      strcpy((char *)&killplayer,pcVar4);
    }
    if ((how & 1U) == 0) {
      local_150 = 0;
      if (((mons[ptr._4_4_].geno & 0x1000) == 0) && ((mvitals[ptr._4_4_].mvflags & 3) == 0)) {
        iVar3 = rn2(3);
        mndx = iVar3 + 4;
        while (((0 < mndx &&
                (pmVar5 = makemon((permonst *)which,level,(int)u.ux,(int)u.uy,1),
                pmVar5 != (monst *)0x0)) &&
               (local_150 = local_150 + 1, (mvitals[ptr._4_4_].mvflags & 1) == 0))) {
          mndx = mndx + -1;
        }
      }
      if (local_150 == 0) {
        pline("Nothing happens.");
      }
      else {
        pcVar4 = makeplural((char *)&killplayer);
        pline("Sent in some %s.",pcVar4);
      }
    }
    else {
      if (only_on_level == '\0') {
        mvitals[ptr._4_4_].mvflags = mvitals[ptr._4_4_].mvflags | 0x12;
      }
      if (*(char *)&mtmp->nmon == 'a') {
        local_188 = (int *)makeplural((char *)&killplayer);
      }
      else {
        local_188 = &killplayer;
      }
      pcVar4 = "";
      if (only_on_level != '\0') {
        pcVar4 = " from this level";
      }
      pline("Wiped out %s%s%s.",mtmp,local_188,pcVar4);
      if (only_on_level == '\0') {
        if (*(char *)&mtmp->nmon == 'a') {
          local_198 = (int *)makeplural((char *)&killplayer);
        }
        else {
          local_198 = &killplayer;
        }
        historic_event('\0',"genocided %s%s",mtmp,local_198);
      }
      if (bVar1) {
        if (only_on_level == '\0') {
          if ((urole.femalenum != -1) && (ptr._4_4_ == urole.malenum)) {
            mvitals[urole.femalenum].mvflags = mvitals[urole.femalenum].mvflags | 0x12;
          }
          if ((urole.femalenum != -1) && (ptr._4_4_ == urole.femalenum)) {
            mvitals[urole.malenum].mvflags = mvitals[urole.malenum].mvflags | 0x12;
          }
          if ((urace.femalenum != -1) && (ptr._4_4_ == urace.malenum)) {
            mvitals[urace.femalenum].mvflags = mvitals[urace.femalenum].mvflags | 0x12;
          }
          if ((urace.femalenum != -1) && (ptr._4_4_ == urace.femalenum)) {
            mvitals[urace.malenum].mvflags = mvitals[urace.malenum].mvflags | 0x12;
          }
        }
        u.uhp = -1;
        if ((how & 2U) == 0) {
          if ((how & 4U) == 0) {
            killer = "scroll of genocide";
          }
          else {
            killer = "imperious order";
          }
          killer_format = 0;
        }
        else {
          killer_format = 1;
          killer = "genocidal confusion";
        }
        if ((u.umonnum == u.umonster) || ((permonst *)which == youmonst.data)) {
          done(10);
        }
        else {
          delayed_killer = killer;
          killer = (char *)0x0;
          pline("You feel dead inside.");
        }
      }
      else if ((permonst *)which == youmonst.data) {
        rehumanize();
      }
      if (only_on_level == '\0') {
        reset_rndmonst(ptr._4_4_);
        kill_genocided_monsters();
        update_inventory();
      }
      else {
        kill_monster_on_level(ptr._4_4_);
      }
    }
  }
  return;
}

Assistant:

void do_genocide(int how, boolean only_on_level)
{
	char buf[BUFSZ];
	int	i, killplayer = 0;
	int mndx;
	const struct permonst *ptr;
	const char *which;

	if (how & PLAYER) {
		mndx = u.umonster;	/* non-polymorphed mon num */
		ptr = &mons[mndx];
		strcpy(buf, mons_mname(ptr));
		killplayer++;
	} else {
	    for (i = 0; ; i++) {
		if (i >= 5) {
		    pline("That's enough tries!");
		    return;
		}
		getlin("What monster do you want to genocide? [type the name]",
			buf);
		mungspaces(buf);
		/* choosing "none" preserves genocideless conduct */
		if (!strcmpi(buf, "none") || !strcmpi(buf, "nothing")) {
		    /* ... but no free pass if cursed */
		    if (!(how & REALLY)) {
			ptr = rndmonst(level);
			if (!ptr) return; /* no message, like normal case */
			mndx = monsndx(ptr);
			break;		/* remaining checks don't apply */
		    } else return;
		}

		if (wizard && buf[0] == '*') {
		    /* to aid in topology testing; remove pesky monsters */
		    struct monst *mtmp, *mtmp2;

		    int gonecnt = 0;
		    for (mtmp = level->monlist; mtmp; mtmp = mtmp2) {
			mtmp2 = mtmp->nmon;
			if (DEADMONSTER(mtmp)) continue;
			mongone(mtmp);
			gonecnt++;
		    }
		    pline("Eliminated %d monster%s.", gonecnt, plur(gonecnt));
		    return;
		}

		mndx = name_to_mon(buf);
		if (mndx == NON_PM || (mvitals[mndx].mvflags & G_GENOD)) {
			pline("Such creatures %s exist in this world.",
			      (mndx == NON_PM) ? "do not" : "no longer");
			continue;
		}
		ptr = &mons[mndx];
		/* Although "genus" is Latin for race, the hero benefits
		 * from both race and role; thus genocide affects either.
		 */
		if (Your_Own_Role(mndx) || Your_Own_Race(mndx)) {
			killplayer++;
			break;
		}
		if (is_human(ptr)) adjalign(-sgn(u.ualign.type));
		if (is_demon(ptr)) adjalign(sgn(u.ualign.type));

		if (!(ptr->geno & G_GENO)) {
			if (flags.soundok) {
	/* fixme: unconditional "caverns" will be silly in some circumstances */
			    if (flags.verbose)
			pline("A thunderous voice booms through the caverns:");
			    verbalize("No, mortal!  That will not be done.");
			}
			continue;
		}
		/* KMH -- Unchanging prevents rehumanization */
		if (Unchanging && ptr == youmonst.data)
		    killplayer++;
		break;
	    }
	}

	which = "all ";
	if (Hallucination) {
	    if (Upolyd)
		strcpy(buf, mons_mname(youmonst.data));
	    else {
		strcpy(buf, (flags.female && urole.name.f) ?
				urole.name.f : urole.name.m);
		buf[0] = lowc(buf[0]);
	    }
	} else {
	    strcpy(buf, mons_mname(ptr)); /* make sure we have standard singular */
	    if ((ptr->geno & G_UNIQ) && ptr != &mons[PM_HIGH_PRIEST])
		which = !type_is_pname(ptr) ? "the " : "";
	}
	if (how & REALLY) {
	    /* setting no-corpse affects wishing and random tin generation */
	    if (!only_on_level)
		mvitals[mndx].mvflags |= (G_GENOD | G_NOCORPSE);
	    pline("Wiped out %s%s%s.", which,
		  (*which != 'a') ? buf : makeplural(buf),
		  only_on_level ? " from this level" : "");
	    if (!only_on_level) {
		historic_event(FALSE, "genocided %s%s", which,
			       (*which != 'a') ? buf : makeplural(buf));
	    }

	    if (killplayer) {
		/* might need to wipe out dual role */
		if (!only_on_level) {
		    if (urole.femalenum != NON_PM && mndx == urole.malenum)
			mvitals[urole.femalenum].mvflags |= (G_GENOD | G_NOCORPSE);
		    if (urole.femalenum != NON_PM && mndx == urole.femalenum)
			mvitals[urole.malenum].mvflags |= (G_GENOD | G_NOCORPSE);
		    if (urace.femalenum != NON_PM && mndx == urace.malenum)
			mvitals[urace.femalenum].mvflags |= (G_GENOD | G_NOCORPSE);
		    if (urace.femalenum != NON_PM && mndx == urace.femalenum)
			mvitals[urace.malenum].mvflags |= (G_GENOD | G_NOCORPSE);
		}

		u.uhp = -1;
		if (how & PLAYER) {
		    killer_format = KILLED_BY;
		    killer = "genocidal confusion";
		} else if (how & ONTHRONE) {
		    /* player selected while on a throne */
		    killer_format = KILLED_BY_AN;
		    killer = "imperious order";
		} else { /* selected player deliberately, not confused */
		    killer_format = KILLED_BY_AN;
		    killer = "scroll of genocide";
		}

	/* Polymorphed characters will die as soon as they're rehumanized. */
	/* KMH -- Unchanging prevents rehumanization */
		if (Upolyd && ptr != youmonst.data) {
			delayed_killer = killer;
			killer = 0;
			pline("You feel dead inside.");
		} else
			done(GENOCIDED);
	    } else if (ptr == youmonst.data) {
		rehumanize();
	    }

	    if (only_on_level) {
		kill_monster_on_level(mndx);
	    } else {
		reset_rndmonst(mndx);
		kill_genocided_monsters();
		update_inventory();	/* in case identified eggs were affected */
	    }
	} else {
	    int cnt = 0;

	    if (!(mons[mndx].geno & G_UNIQ) &&
		    !(mvitals[mndx].mvflags & (G_GENOD | G_EXTINCT)))
		for (i = rn1(3, 4); i > 0; i--) {
		    if (!makemon(ptr, level, u.ux, u.uy, NO_MINVENT))
			break;	/* couldn't make one */
		    ++cnt;
		    if (mvitals[mndx].mvflags & G_EXTINCT)
			break;	/* just made last one */
		}
	    if (cnt)
		pline("Sent in some %s.", makeplural(buf));
	    else
		pline("Nothing happens.");
	}
}